

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::InlineRep::remove_prefix(InlineRep *this,size_t n)

{
  char *dst;
  char *pcVar1;
  size_t sVar2;
  size_t n_local;
  InlineRep *this_local;
  
  dst = cord_internal::InlineData::as_chars(&this->data_);
  pcVar1 = cord_internal::InlineData::as_chars(&this->data_);
  sVar2 = inline_size(this);
  cord_internal::SmallMemmove<false>(dst,pcVar1 + n,sVar2 - n);
  reduce_size(this,n);
  return;
}

Assistant:

inline void Cord::InlineRep::remove_prefix(size_t n) {
  cord_internal::SmallMemmove(data_.as_chars(), data_.as_chars() + n,
                              inline_size() - n);
  reduce_size(n);
}